

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O0

int Saig_StrSimIsOne(Aig_Obj_t *pObj)

{
  int local_24;
  int i;
  uint *pSims;
  Aig_Obj_t *pObj_local;
  
  local_24 = 0;
  while( true ) {
    if (0xf < local_24) {
      return 1;
    }
    if (*(int *)((long)(pObj->field_5).pData + (long)local_24 * 4) != -1) break;
    local_24 = local_24 + 1;
  }
  return 0;
}

Assistant:

int Saig_StrSimIsOne( Aig_Obj_t * pObj )
{
    unsigned * pSims = (unsigned *)pObj->pData;
    int i;
    for ( i = 0; i < SAIG_WORDS; i++ )
        if ( pSims[i] != ~0 )
            return 0;
    return 1;
}